

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_set_mllr_filename(char *fn)

{
  FILE *pFVar1;
  FILE *mllr_fp;
  char *mllr_filename;
  char *fn_local;
  
  if (data_dir[0] != (char *)0x0) {
    __assert_fail("data_dir[DATA_TYPE_SENT] == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                  ,0x3d8,"int corpus_set_mllr_filename(const char *)");
  }
  pFVar1 = fopen(fn,"r");
  if (pFVar1 == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                   ,0x3de,"Cannot open MLLR filename %s",fn);
    exit(1);
  }
  return 0;
}

Assistant:

int
corpus_set_mllr_filename(const char *fn)
{
    const char *mllr_filename = NULL;
    FILE *mllr_fp = NULL;

    assert(data_dir[DATA_TYPE_SENT] == NULL);

    mllr_filename = fn;

    mllr_fp = fopen(mllr_filename, "r");
    if (mllr_fp == NULL) {
	E_FATAL_SYSTEM("Cannot open MLLR filename %s", mllr_filename);
    }

    return S3_SUCCESS;
}